

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O2

void Vec_IntLits2Vars(Vec_Int_t *p,int Shift)

{
  int iVar1;
  int i;
  long lVar2;
  
  for (lVar2 = 0; lVar2 < p->nSize; lVar2 = lVar2 + 1) {
    iVar1 = Abc_Lit2Var(p->pArray[lVar2]);
    p->pArray[lVar2] = iVar1 + Shift;
  }
  return;
}

Assistant:

static inline void Vec_IntLits2Vars( Vec_Int_t * p, int Shift )
{
    int i;
    for ( i = 0; i < p->nSize; i++ )
        p->pArray[i] = Abc_Lit2Var( p->pArray[i] ) + Shift;
}